

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O2

SerializedMessage *
miniros::serialization::serializeServiceResponse<unsigned_int>
          (SerializedMessage *__return_storage_ptr__,bool ok,uint *message)

{
  uchar *puVar1;
  undefined7 in_register_00000031;
  OStream s;
  
  (__return_storage_ptr__->message).super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->message).super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __return_storage_ptr__->num_bytes = 0;
  __return_storage_ptr__->message_start = (uint8_t *)0x0;
  (__return_storage_ptr__->buf).super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->buf).super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __return_storage_ptr__->type_info = (type_info *)0x0;
  if ((int)CONCAT71(in_register_00000031,ok) == 0) {
    __return_storage_ptr__->num_bytes = 5;
    puVar1 = (uchar *)operator_new__(5);
    std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::reset<unsigned_char>
              ((__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__,
               puVar1);
    s.super_Stream.data_ =
         (__return_storage_ptr__->buf).
         super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    s.super_Stream.end_ = s.super_Stream.data_ + (uint)__return_storage_ptr__->num_bytes;
    Serializer<unsigned_char>::write<miniros::serialization::OStream>(&s,ok);
    serialize<unsigned_int,miniros::serialization::OStream>(&s,message);
  }
  else {
    __return_storage_ptr__->num_bytes = 9;
    puVar1 = (uchar *)operator_new__(9);
    std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::reset<unsigned_char>
              ((__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__,
               puVar1);
    s.super_Stream.data_ =
         (__return_storage_ptr__->buf).
         super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    s.super_Stream.end_ = s.super_Stream.data_ + (uint)__return_storage_ptr__->num_bytes;
    Serializer<unsigned_char>::write<miniros::serialization::OStream>(&s,ok);
    Serializer<unsigned_int>::write<miniros::serialization::OStream>
              (&s,(int)__return_storage_ptr__->num_bytes - 5);
    serialize<unsigned_int,miniros::serialization::OStream>(&s,message);
  }
  return __return_storage_ptr__;
}

Assistant:

inline SerializedMessage serializeServiceResponse(bool ok, const M& message)
{
  SerializedMessage m;

  if (ok)
  {
    uint32_t len = serializationLength(message);
    m.num_bytes = len + 5;
    m.buf.reset(new uint8_t[m.num_bytes]);

    OStream s(m.buf.get(), static_cast<uint32_t>(m.num_bytes));
    serialize(s, static_cast<uint8_t>(ok));
    serialize(s, static_cast<uint32_t>(m.num_bytes) - 5);
    serialize(s, message);
  }
  else
  {
    uint32_t len = serializationLength(message);
    m.num_bytes = len + 1;
    m.buf.reset(new uint8_t[m.num_bytes]);

    OStream s(m.buf.get(), static_cast<uint32_t>(m.num_bytes));
    serialize(s, static_cast<uint8_t>(ok));
    serialize(s, message);
  }

  return m;
}